

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_test.cpp
# Opt level: O2

void __thiscall check_computations_of_distances::test_method(check_computations_of_distances *this)

{
  int in_ECX;
  double dVar1;
  allocator<char> local_89;
  Persistence_landscape q;
  Persistence_landscape p;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> diag2;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> diag;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,"data/file_with_diagram",(allocator<char> *)&q);
  Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
            (&diag,(Persistence_representations *)&p,(string *)0xffffffffffffffff,in_ECX,-1.0);
  std::__cxx11::string::~string((string *)&p);
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            (&p,&diag,0xffffffffffffffff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"data/file_with_diagram_1",&local_89);
  Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
            (&diag2,(Persistence_representations *)&q,(string *)0xffffffffffffffff,in_ECX,-1.0);
  std::__cxx11::string::~string((string *)&q);
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            (&q,&diag2,0xffffffffffffffff);
  dVar1 = Gudhi::Persistence_representations::compute_distance_of_landscapes(&p,&q,1.0);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,25.5824,epsilon);
  dVar1 = Gudhi::Persistence_representations::compute_distance_of_landscapes(&p,&q,2.0);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,2.1264,epsilon);
  dVar1 = Gudhi::Persistence_representations::compute_max_norm_distance_of_landscapes(&p,&q);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,0.359068,epsilon);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&q.land);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&diag2.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&p.land);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&diag.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_computations_of_distances) {
  std::vector<std::pair<double, double> > diag =
      read_persistence_intervals_in_one_dimension_from_file("data/file_with_diagram");
  Persistence_landscape p(diag);
  std::vector<std::pair<double, double> > diag2 =
      read_persistence_intervals_in_one_dimension_from_file("data/file_with_diagram_1");
  Persistence_landscape q(diag2);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q), 25.5824, epsilon);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q, 2), 2.1264, epsilon);
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.distance(q, std::numeric_limits<double>::max()), 0.359068, epsilon);
}